

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCString.h
# Opt level: O0

__ssize_t GenICam_3_4::getline(char **__lineptr,size_t *__n,FILE *__stream)

{
  size_t *psVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bad_alloc *anon_var_0;
  string tmp;
  string local_38 [39];
  char local_11;
  size_t *local_10;
  istream *local_8;
  
  local_11 = (char)__stream;
  local_10 = __n;
  local_8 = (istream *)__lineptr;
  std::__cxx11::string::string(local_38);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(local_8,local_38,local_11);
  psVar1 = local_10;
  uVar2 = std::__cxx11::string::c_str();
  uVar3 = std::__cxx11::string::size();
  (**(code **)(*psVar1 + 0x38))(psVar1,uVar2,uVar3);
  std::__cxx11::string::~string(local_38);
  return (__ssize_t)local_8;
}

Assistant:

inline std::istream &  getline(std::istream& is, GENICAM_NAMESPACE::gcstring& str, char delim)
    {
        try
        {
            std::string tmp;
            std::getline(is, tmp, delim);
            str.assign(tmp.c_str(), tmp.size());
        }
        catch(std::bad_alloc &)
        {
            ThrowBadAlloc(__FILE__, __LINE__);
        }
        return is;
    }